

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamping.c
# Opt level: O0

timestamp_info * pop_pending_tx_timestamps(pending_tx_timestamps *tx_timestamps)

{
  uint uVar1;
  uint uVar2;
  timestamp_info *local_18;
  timestamp_info *ret;
  pending_tx_timestamps *tx_timestamps_local;
  
  local_18 = (timestamp_info *)0x0;
  if (tx_timestamps->consumed <= tx_timestamps->head) {
    if (tx_timestamps->consumed < tx_timestamps->tail) {
      local_18 = tx_timestamps->pending;
      uVar1 = tx_timestamps->consumed;
      tx_timestamps->consumed = uVar1 + 1;
      uVar2 = get_max_pending_reqs();
      local_18 = local_18 + (ulong)uVar1 % (ulong)uVar2;
    }
    return local_18;
  }
  __assert_fail("tx_timestamps->consumed <= tx_timestamps->head",
                "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/timestamping.c"
                ,0x12a,
                "struct timestamp_info *pop_pending_tx_timestamps(struct pending_tx_timestamps *)");
}

Assistant:

struct timestamp_info *
pop_pending_tx_timestamps(struct pending_tx_timestamps *tx_timestamps)
{
	struct timestamp_info *ret = NULL;

	assert(tx_timestamps->consumed <= tx_timestamps->head);
	if (tx_timestamps->consumed < tx_timestamps->tail)
		ret =
			&tx_timestamps
				 ->pending[tx_timestamps->consumed++ % get_max_pending_reqs()];

	return ret;
}